

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

void __thiscall RString::Capitalize(RString *this)

{
  long *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  PrepForMod((RString *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (('`' < *(char *)*in_RDI) && (*(char *)*in_RDI < '{')) {
    *(char *)*in_RDI = *(char *)*in_RDI + -0x20;
  }
  for (iVar1 = 1; *(char *)(*in_RDI + (long)iVar1) != '\0'; iVar1 = iVar1 + 1) {
    if (('@' < *(char *)(*in_RDI + (long)iVar1)) && (*(char *)(*in_RDI + (long)iVar1) < '[')) {
      *(char *)(*in_RDI + (long)iVar1) = *(char *)(*in_RDI + (long)iVar1) + ' ';
    }
  }
  return;
}

Assistant:

void RString::Capitalize(void)
{
	PrepForMod();
	if(*myString >= 'a' && *myString <= 'z')
		*myString += 'A' - 'a';
	for(int i = 1; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}